

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O1

void __thiscall
spirv_cross::SmallVector<spirv_cross::Meta::Decoration,_0UL>::reserve
          (SmallVector<spirv_cross::Meta::Decoration,_0UL> *this,size_t count)

{
  undefined8 *puVar1;
  Decoration *pDVar2;
  char *pcVar3;
  undefined8 *puVar4;
  ulong uVar5;
  Decoration *pDVar6;
  ulong uVar7;
  long lVar8;
  
  if (count < 0xa72f05397829cc) {
    uVar7 = this->buffer_capacity;
    if (uVar7 < count) {
      uVar7 = uVar7 + (uVar7 == 0);
      do {
        uVar5 = uVar7;
        uVar7 = uVar5 * 2;
      } while (uVar5 < count);
      if (uVar5 == 0) {
        pDVar6 = (Decoration *)0x0;
      }
      else {
        pDVar6 = (Decoration *)malloc(uVar5 * 0x188);
      }
      if (pDVar6 == (Decoration *)0x0) goto LAB_002e5424;
      if ((pDVar6 != (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr) &&
         ((this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size != 0)) {
        lVar8 = 0;
        uVar7 = 0;
        do {
          Meta::Decoration::Decoration
                    ((Decoration *)((long)&(pDVar6->alias)._M_dataplus._M_p + lVar8),
                     (Decoration *)
                     ((long)&(((this->super_VectorView<spirv_cross::Meta::Decoration>).ptr)->alias).
                             _M_dataplus._M_p + lVar8));
          pDVar2 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)(pDVar2->extended).values + lVar8 + -0x38));
          ::std::
          _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                         *)((long)&(pDVar2->decoration_flags).higher._M_h._M_buckets + lVar8));
          pcVar3 = *(char **)((long)&(pDVar2->user_type)._M_dataplus._M_p + lVar8);
          if ((pDVar2->user_type).field_2._M_local_buf + lVar8 != pcVar3) {
            operator_delete(pcVar3);
          }
          pcVar3 = *(char **)((long)&(pDVar2->hlsl_semantic)._M_dataplus._M_p + lVar8);
          if ((pDVar2->hlsl_semantic).field_2._M_local_buf + lVar8 != pcVar3) {
            operator_delete(pcVar3);
          }
          pcVar3 = *(char **)((long)&(pDVar2->qualified_alias)._M_dataplus._M_p + lVar8);
          if ((pDVar2->qualified_alias).field_2._M_local_buf + lVar8 != pcVar3) {
            operator_delete(pcVar3);
          }
          puVar1 = (undefined8 *)((long)&(pDVar2->alias)._M_dataplus._M_p + lVar8);
          puVar4 = (undefined8 *)*puVar1;
          if (puVar1 + 2 != puVar4) {
            operator_delete(puVar4);
          }
          uVar7 = uVar7 + 1;
          lVar8 = lVar8 + 0x188;
        } while (uVar7 < (this->super_VectorView<spirv_cross::Meta::Decoration>).buffer_size);
      }
      pDVar2 = (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr;
      if (pDVar2 != (Decoration *)0x0) {
        free(pDVar2);
      }
      (this->super_VectorView<spirv_cross::Meta::Decoration>).ptr = pDVar6;
      this->buffer_capacity = uVar5;
    }
    return;
  }
LAB_002e5424:
  ::std::terminate();
}

Assistant:

void reserve(size_t count) SPIRV_CROSS_NOEXCEPT
	{
		if ((count > (std::numeric_limits<size_t>::max)() / sizeof(T)) ||
		    (count > (std::numeric_limits<size_t>::max)() / 2))
		{
			// Only way this should ever happen is with garbage input, terminate.
			std::terminate();
		}

		if (count > buffer_capacity)
		{
			size_t target_capacity = buffer_capacity;
			if (target_capacity == 0)
				target_capacity = 1;

			// Weird parens works around macro issues on Windows if NOMINMAX is not used.
			target_capacity = (std::max)(target_capacity, N);

			// Need to ensure there is a POT value of target capacity which is larger than count,
			// otherwise this will overflow.
			while (target_capacity < count)
				target_capacity <<= 1u;

			T *new_buffer =
			    target_capacity > N ? static_cast<T *>(malloc(target_capacity * sizeof(T))) : stack_storage.data();

			// If we actually fail this malloc, we are hosed anyways, there is no reason to attempt recovery.
			if (!new_buffer)
				std::terminate();

			// In case for some reason two allocations both come from same stack.
			if (new_buffer != this->ptr)
			{
				// We don't deal with types which can throw in move constructor.
				for (size_t i = 0; i < this->buffer_size; i++)
				{
					new (&new_buffer[i]) T(std::move(this->ptr[i]));
					this->ptr[i].~T();
				}
			}

			if (this->ptr != stack_storage.data())
				free(this->ptr);
			this->ptr = new_buffer;
			buffer_capacity = target_capacity;
		}
	}